

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_open1(archive *_a)

{
  archive_string_conv **ppaVar1;
  long lVar2;
  undefined8 *puVar3;
  archive_read_filter *paVar4;
  code *pcVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  archive_read_filter *paVar11;
  void *pvVar12;
  archive_string_conv **ppaVar13;
  archive_read_filter *paVar14;
  char *fmt;
  long lVar15;
  archive_read_filter *self;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long local_38;
  
  iVar8 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar8 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].compression_name == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
    _a->state = 0x8000;
    return -0x1e;
  }
  if ((*(code **)&_a[1].compression_code != (code *)0x0) &&
     (iVar8 = (**(code **)&_a[1].compression_code)
                        (_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + 0x10)), iVar8 != 0))
  {
    if (_a[1].error_string.s == (char *)0x0) {
      return iVar8;
    }
    if ((int)_a[1].error_string.buffer_length == 0) {
      return iVar8;
    }
    lVar19 = 0x10;
    uVar17 = 0;
    do {
      (*(code *)_a[1].error_string.s)(_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + lVar19))
      ;
      uVar17 = uVar17 + 1;
      lVar19 = lVar19 + 0x18;
    } while (uVar17 < (uint)_a[1].error_string.buffer_length);
    return iVar8;
  }
  paVar11 = (archive_read_filter *)calloc(1,0xb0);
  if (paVar11 == (archive_read_filter *)0x0) {
    return -0x1e;
  }
  paVar11->archive = (archive_read *)_a;
  puVar3 = *(undefined8 **)&_a[1].current_codepage;
  paVar11->data = (void *)puVar3[2];
  paVar11->open = client_open_proxy;
  paVar11->read = client_read_proxy;
  paVar11->skip = client_skip_proxy;
  paVar11->seek = client_seek_proxy;
  paVar11->close = client_close_proxy;
  paVar11->sswitch = client_switch_proxy;
  paVar11->name = "none";
  *puVar3 = 0;
  self = (archive_read_filter *)_a[6].error_string.length;
  if ((self == (archive_read_filter *)0x0) ||
     (paVar4 = self, (int)_a[6].error_string.buffer_length == 0)) {
    _a[6].error_string.length = (size_t)paVar11;
    iVar8 = 0;
    do {
      lVar15 = 0;
      lVar19 = 0;
      iVar10 = 0;
      do {
        pcVar5 = *(code **)((long)&_a[1].read_data_offset + lVar15);
        if (pcVar5 != (code *)0x0) {
          lVar2 = (long)&_a[1].sconv + lVar15;
          iVar9 = (*pcVar5)(lVar2,_a[6].error_string.length);
          if (iVar10 < iVar9) {
            lVar19 = lVar2;
            iVar10 = iVar9;
          }
        }
        lVar15 = lVar15 + 0x30;
      } while ((int)lVar15 != 0x300);
      if (lVar19 == 0) {
        __archive_read_filter_ahead((archive_read_filter *)_a[6].error_string.length,1,&local_38);
        if (local_38 < 0) {
          __archive_read_close_filters((archive_read *)_a);
          pvVar12 = (void *)_a[6].error_string.length;
          while (pvVar12 != (void *)0x0) {
            pvVar6 = *(void **)((long)pvVar12 + 0x10);
            free(pvVar12);
            _a[6].error_string.length = (size_t)pvVar6;
            pvVar12 = pvVar6;
          }
          goto LAB_00162433;
        }
        self = (archive_read_filter *)_a[6].error_string.length;
        _a->compression_name = self->name;
        _a->compression_code = self->code;
        goto LAB_001622d5;
      }
      pvVar12 = calloc(1,0xb0);
      if (pvVar12 == (void *)0x0) goto LAB_00162433;
      *(long *)((long)pvVar12 + 8) = lVar19;
      *(archive **)((long)pvVar12 + 0x18) = _a;
      *(size_t *)((long)pvVar12 + 0x10) = _a[6].error_string.length;
      _a[6].error_string.length = (size_t)pvVar12;
      iVar10 = (**(code **)(lVar19 + 0x18))(pvVar12);
      if (iVar10 != 0) {
        __archive_read_close_filters((archive_read *)_a);
        pvVar12 = (void *)_a[6].error_string.length;
        while (pvVar12 != (void *)0x0) {
          pvVar6 = *(void **)((long)pvVar12 + 0x10);
          free(pvVar12);
          _a[6].error_string.length = (size_t)pvVar6;
          pvVar12 = pvVar6;
        }
        goto LAB_00162433;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0x19);
    archive_set_error(_a,0x54,"Input requires too many filters for decoding");
  }
  else {
    do {
      paVar14 = paVar4;
      paVar4 = paVar14->upstream;
    } while (paVar4 != (archive_read_filter *)0x0);
    paVar14->upstream = paVar11;
LAB_001622d5:
    if (_a[0xf].error_string.length != 0) {
LAB_001622df:
      _a->state = 2;
      client_switch_proxy(self,0);
      return 0;
    }
    ppaVar1 = &_a[6].sconv;
    _a[0xf].error_string.length = (size_t)ppaVar1;
    uVar18 = 0;
    uVar16 = 0xffffffff;
    iVar8 = -1;
    ppaVar13 = ppaVar1;
    do {
      if (ppaVar13[2] != (archive_string_conv *)0x0) {
        iVar10 = (*(code *)ppaVar13[2])(_a);
        if (iVar10 == -0x1e) goto LAB_0016242b;
        paVar11 = (archive_read_filter *)_a[6].error_string.length;
        if (paVar11->position != 0) {
          __archive_read_filter_seek(paVar11,0,0);
        }
        uVar7 = uVar18;
        if (-1 < (int)uVar16 && iVar10 <= iVar8) {
          uVar7 = uVar16;
          iVar10 = iVar8;
        }
        uVar16 = uVar7;
        ppaVar13 = (archive_string_conv **)_a[0xf].error_string.length;
        iVar8 = iVar10;
      }
      uVar18 = uVar18 + 1;
      ppaVar13 = ppaVar13 + 0xb;
      _a[0xf].error_string.length = (size_t)ppaVar13;
    } while (uVar18 != 0x10);
    if ((int)uVar16 < 0) {
      fmt = "No formats registered";
    }
    else {
      if (0 < iVar8) {
        _a[0xf].error_string.length = (size_t)(ppaVar1 + (ulong)uVar16 * 0xb);
        self = (archive_read_filter *)_a[6].error_string.length;
        goto LAB_001622df;
      }
      fmt = "Unrecognized archive format";
    }
    archive_set_error(_a,0x54,fmt);
LAB_0016242b:
    __archive_read_close_filters((archive_read *)_a);
  }
LAB_00162433:
  _a->state = 0x8000;
  return -0x1e;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			__archive_read_close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}